

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

ssize_t __thiscall
boost::deflate::deflate_stream_test::ZlibCompressor::write
          (ZlibCompressor *this,int __fd,void *__buf,size_t __n)

{
  error e;
  int iVar1;
  undefined8 uVar2;
  error_code local_40;
  invalid_argument local_30 [16];
  source_location local_20;
  
  if (((this->zs).next_in == (Bytef *)0x0) && ((this->zs).avail_in != 0)) {
    std::invalid_argument::invalid_argument(local_30,"zlib compressor: invalid input");
    local_20.file_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
    ;
    local_20.function_ =
         "virtual error_code boost::deflate::deflate_stream_test::ZlibCompressor::write(Flush)";
    local_20.line_ = 0x5e;
    local_20.column_ = 0;
    throw_exception<std::invalid_argument>(local_30,&local_20);
  }
  iVar1 = ::deflate(&this->zs,write::zlib_flushes[__fd]);
  switch(iVar1) {
  case 0:
    local_40.val_ = 0;
    local_40._4_4_ = local_40._4_4_ & 0xffffff00;
    goto LAB_00106d45;
  case 1:
    e = end_of_stream;
    break;
  case -5:
    e = need_buffers;
    break;
  default:
    uVar2 = __cxa_rethrow();
    std::invalid_argument::~invalid_argument(local_30);
    _Unwind_Resume(uVar2);
  case -2:
    e = stream_error;
  }
  system::error_code::error_code<boost::deflate::error>(&local_40,e,(type *)0x0);
LAB_00106d45:
  return CONCAT44(local_40._4_4_,local_40.val_);
}

Assistant:

error_code write(Flush flush) override {
            constexpr static int zlib_flushes[] = {0, Z_BLOCK, Z_PARTIAL_FLUSH, Z_SYNC_FLUSH, Z_FULL_FLUSH, Z_FINISH, Z_TREES};
            const auto zlib_flush = zlib_flushes[static_cast<int>(flush)];
            if(zs.next_in == nullptr && zs.avail_in != 0)
              BOOST_THROW_EXCEPTION(std::invalid_argument{"zlib compressor: invalid input"});
            const auto res = ::deflate(&zs, zlib_flush);
            switch(res){
            case Z_OK:
                return {};
            case Z_STREAM_END:
                return error::end_of_stream;
            case Z_STREAM_ERROR:
                return error::stream_error;
            case Z_BUF_ERROR:
                return error::need_buffers;
            default:
                throw;
            }
        }